

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::TiledOutputFile::~TiledOutputFile(TiledOutputFile *this)

{
  OStream *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  Data *this_00;
  Lock local_20;
  
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__TiledOutputFile_00421728;
  if (this->_data == (Data *)0x0) goto LAB_001bd2d6;
  local_20._mutex = &this->_streamData->super_Mutex;
  std::mutex::lock(local_20._mutex);
  local_20._locked = true;
  iVar2 = (*this->_streamData->os->_vptr_OStream[3])();
  if (this->_data->tileOffsetsPosition != 0) {
    (*this->_streamData->os->_vptr_OStream[4])();
    TileOffsets::writeTo(&this->_data->tileOffsets,this->_streamData->os);
    pOVar1 = this->_streamData->os;
    (*pOVar1->_vptr_OStream[4])(pOVar1,CONCAT44(extraout_var,iVar2));
  }
  IlmThread_2_5::Lock::~Lock(&local_20);
  if (((this->_deleteStream == true) && (this->_streamData != (OutputStreamMutex *)0x0)) &&
     (pOVar1 = this->_streamData->os, pOVar1 != (OStream *)0x0)) {
    (*pOVar1->_vptr_OStream[1])();
  }
  this_00 = this->_data;
  if (this_00->partNumber == -1) {
    operator_delete(this->_streamData,0x38);
    this_00 = this->_data;
    if (this_00 != (Data *)0x0) goto LAB_001bd2c1;
    this_00 = (Data *)0x0;
  }
  else {
LAB_001bd2c1:
    Data::~Data(this_00);
  }
  operator_delete(this_00,0x178);
LAB_001bd2d6:
  GenericOutputFile::~GenericOutputFile(&this->super_GenericOutputFile);
  return;
}

Assistant:

TiledOutputFile::~TiledOutputFile ()
{
    if (_data)
    {
        {
            Lock lock(*_streamData);
            Int64 originalPosition = _streamData->os->tellp();

            if (_data->tileOffsetsPosition > 0)
            {
                try
                {
                    _streamData->os->seekp (_data->tileOffsetsPosition);
                    _data->tileOffsets.writeTo (*_streamData->os);

                    //
                    // Restore the original position.
                    //
                    _streamData->os->seekp (originalPosition);
                }
                catch (...) //NOSONAR - suppress vulnerability reports from SonarCloud.
                {
                    //
                    // We cannot safely throw any exceptions from here.
                    // This destructor may have been called because the
                    // stack is currently being unwound for another
                    // exception.
                    //
                }
            }
        }
        
        if (_deleteStream && _streamData)
            delete _streamData->os;

        if (_data->partNumber == -1)
            delete _streamData;

        delete _data;
    }
}